

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
immutable::vector<int,_false,_6>::operator==
          (vector<int,_false,_6> *this,vector<int,_false,_6> *other)

{
  int iVar1;
  bool bVar2;
  size_type_conflict sVar3;
  size_type_conflict sVar4;
  reference piVar5;
  undefined1 local_90 [8];
  iterator it_end;
  undefined1 local_60 [8];
  iterator it2;
  iterator it;
  vector<int,_false,_6> *other_local;
  vector<int,_false,_6> *this_local;
  
  sVar3 = size(this);
  sVar4 = size(other);
  if (sVar3 == sVar4) {
    sVar3 = size(this);
    if (sVar3 == 0) {
      this_local._7_1_ = true;
    }
    else {
      begin((iterator *)
            &it2._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
             super__Head_base<0UL,_const_int_*,_false>,this);
      begin((iterator *)local_60,other);
      end((iterator *)local_90,this);
      while( true ) {
        bVar2 = vector_iterator<int,_false,_6>::operator!=
                          ((vector_iterator<int,_false,_6> *)
                           &it2._cursor.
                            super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
                            super__Head_base<0UL,_const_int_*,_false>,(self_type *)local_90);
        if (!bVar2) break;
        piVar5 = vector_iterator<int,_false,_6>::operator*
                           ((vector_iterator<int,_false,_6> *)
                            &it2._cursor.
                             super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
                             super__Head_base<0UL,_const_int_*,_false>);
        iVar1 = *piVar5;
        piVar5 = vector_iterator<int,_false,_6>::operator*
                           ((vector_iterator<int,_false,_6> *)local_60);
        if (iVar1 != *piVar5) {
          this_local._7_1_ = false;
          goto LAB_0018300f;
        }
        vector_iterator<int,_false,_6>::operator++
                  ((vector_iterator<int,_false,_6> *)
                   &it2._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
                    super__Head_base<0UL,_const_int_*,_false>);
        vector_iterator<int,_false,_6>::operator++((vector_iterator<int,_false,_6> *)local_60);
      }
      this_local._7_1_ = true;
LAB_0018300f:
      vector_iterator<int,_false,_6>::~vector_iterator((vector_iterator<int,_false,_6> *)local_90);
      vector_iterator<int,_false,_6>::~vector_iterator((vector_iterator<int,_false,_6> *)local_60);
      vector_iterator<int,_false,_6>::~vector_iterator
                ((vector_iterator<int,_false,_6> *)
                 &it2._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
                  super__Head_base<0UL,_const_int_*,_false>);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator == (const vector& other) const
        {
        if (size() != other.size())
          return false;
        if (size() == 0)
          return true;
        auto it = begin();
        auto it2 = other.begin();
        auto it_end = end();
        for (; it != it_end; ++it, ++it2)
          {
          if (*it != *it2)
            return false;
          }
        return true;
        }